

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

ssize_t on_session_send(nghttp2_session *h2,uint8_t *buf,size_t blen,int flags,void *userp)

{
  ssize_t sVar1;
  Curl_easy *data;
  CURLcode result;
  CURLcode local_c;
  
  if (userp == (void *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 8);
  }
  local_c = CURLE_OK;
  sVar1 = Curl_bufq_write_pass
                    ((bufq *)(*(long *)((long)userp + 0x10) + 0x50),buf,blen,proxy_h2_nw_out_writer,
                     userp,&local_c);
  if (sVar1 < 0) {
    sVar1 = -0x1f8;
    if (local_c != CURLE_AGAIN) {
      Curl_failf(data,"Failed sending HTTP2 data");
      sVar1 = -0x386;
    }
  }
  else if (sVar1 == 0) {
    sVar1 = -0x1f8;
  }
  return sVar1;
}

Assistant:

static ssize_t on_session_send(nghttp2_session *h2,
                               const uint8_t *buf, size_t blen, int flags,
                               void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nwritten;
  CURLcode result = CURLE_OK;

  (void)h2;
  (void)flags;
  DEBUGASSERT(data);

  nwritten = Curl_bufq_write_pass(&ctx->outbufq, buf, blen,
                                  proxy_h2_nw_out_writer, cf, &result);
  if(nwritten < 0) {
    if(result == CURLE_AGAIN) {
      return NGHTTP2_ERR_WOULDBLOCK;
    }
    failf(data, "Failed sending HTTP2 data");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  if(!nwritten)
    return NGHTTP2_ERR_WOULDBLOCK;

  return nwritten;
}